

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclSize.c
# Opt level: O3

float Abc_SclCountNonBufferDelayInt(SC_Man *p,Abc_Obj_t *pObj)

{
  int *piVar1;
  void **ppvVar2;
  long lVar3;
  long lVar4;
  float fVar5;
  float fVar6;
  
  if (((*(uint *)&pObj->field_0x14 & 0xf) == 7) && ((pObj->vFanins).nSize == 1)) {
    lVar4 = (long)(pObj->vFanouts).nSize;
    if (lVar4 < 1) {
      fVar5 = 0.0;
    }
    else {
      piVar1 = (pObj->vFanouts).pArray;
      ppvVar2 = pObj->pNtk->vObjs->pArray;
      fVar5 = 0.0;
      lVar3 = 0;
      do {
        fVar6 = Abc_SclCountNonBufferDelayInt(p,(Abc_Obj_t *)ppvVar2[piVar1[lVar3]]);
        fVar5 = fVar5 + fVar6;
        lVar3 = lVar3 + 1;
      } while (lVar4 != lVar3);
    }
  }
  else {
    fVar5 = p->pTimes[(uint)pObj->Id].rise;
    fVar6 = p->pTimes[(uint)pObj->Id].fall;
    if (fVar5 <= fVar6) {
      fVar5 = fVar6;
    }
  }
  return fVar5;
}

Assistant:

float Abc_SclCountNonBufferDelayInt( SC_Man * p, Abc_Obj_t * pObj )
{
    Abc_Obj_t * pFanout;
    float Delay = 0;
    int i; 
    if ( !Abc_ObjIsBuffer(pObj) )
        return Abc_SclObjTimeMax(p, pObj);
    Abc_ObjForEachFanout( pObj, pFanout, i )
        Delay += Abc_SclCountNonBufferDelayInt( p, pFanout );
    return Delay;
}